

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O1

void __thiscall
duckdb::RowGroupCollection::AppendRowGroup(RowGroupCollection *this,SegmentLock *l,idx_t start_row)

{
  _Head_base<0UL,_duckdb::RowGroup_*,_false> _Var1;
  RowGroup *this_00;
  pointer this_01;
  RowGroupSegmentTree *this_02;
  templated_unique_single_t new_row_group;
  _Head_base<0UL,_duckdb::RowGroup_*,_false> local_30;
  _Head_base<0UL,_duckdb::RowGroup_*,_false> local_28;
  
  this_00 = (RowGroup *)operator_new(200);
  RowGroup::RowGroup(this_00,this,start_row,0);
  local_28._M_head_impl = this_00;
  this_01 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::operator->
                      ((unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *)
                       &local_28);
  RowGroup::InitializeEmpty(this_01,&this->types);
  this_02 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(&this->row_groups);
  local_30._M_head_impl = local_28._M_head_impl;
  local_28._M_head_impl = (RowGroup *)0x0;
  SegmentTree<duckdb::RowGroup,_true>::AppendSegment
            (&this_02->super_SegmentTree<duckdb::RowGroup,_true>,l,
             (unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *)&local_30)
  ;
  _Var1._M_head_impl = local_30._M_head_impl;
  if (local_30._M_head_impl != (RowGroup *)0x0) {
    RowGroup::~RowGroup(local_30._M_head_impl);
    operator_delete(_Var1._M_head_impl);
  }
  _Var1._M_head_impl = local_28._M_head_impl;
  local_30._M_head_impl = (RowGroup *)0x0;
  if (local_28._M_head_impl != (RowGroup *)0x0) {
    RowGroup::~RowGroup(local_28._M_head_impl);
    operator_delete(_Var1._M_head_impl);
  }
  return;
}

Assistant:

void RowGroupCollection::AppendRowGroup(SegmentLock &l, idx_t start_row) {
	D_ASSERT(start_row >= row_start);
	auto new_row_group = make_uniq<RowGroup>(*this, start_row, 0U);
	new_row_group->InitializeEmpty(types);
	row_groups->AppendSegment(l, std::move(new_row_group));
}